

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O2

void __thiscall MainWindow::on_actionAbout_triggered(MainWindow *this)

{
  char *pcVar1;
  QArrayDataPointer<char16_t> local_e0;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  QString mt32emuVersion;
  
  pcVar1 = MT32Emu::Synth::getLibraryVersionString();
  QString::QString(&mt32emuVersion,pcVar1);
  QString::QString((QString *)&local_38,"About");
  operator+((QString *)&local_c8,
            "Munt - Roland (R) MT-32 sound module emulator\n\nMunt mt32emu_qt GUI Application Version 1.11.1\nMunt Library Version "
            ,&mt32emuVersion);
  operator+((QString *)&local_b0,(QString *)&local_c8,"\nQt Library Version ");
  pcVar1 = (char *)qVersion();
  operator+((QString *)&local_98,(QString *)&local_b0,pcVar1);
  operator+((QString *)&local_80,(QString *)&local_98,"\n\nBuild Arch: Linux ");
  QString::number((int)&local_e0,0x40);
  operator+((QString *)&local_68,(QString *)&local_80,(QString *)&local_e0);
  operator+((QString *)&local_50,(QString *)&local_68,
            "-bit\nBuild Date: May  3 2025\n\nCopyright (C) 2011-2022 Jerome Fisher, Sergey V. Mikayev\n\nLicensed under GPL v3 or any later version."
           );
  QMessageBox::about((QWidget *)this,(QString *)&local_38,(QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&mt32emuVersion.d);
  return;
}

Assistant:

void MainWindow::on_actionAbout_triggered() {
#ifdef BUILD_MT32EMU_VERSION
	QString mt32emuVersion = BUILD_MT32EMU_VERSION;
#else
	QString mt32emuVersion = MT32Emu::Synth::getLibraryVersionString();
#endif
	QMessageBox::about(this, "About",
		"Munt - Roland (R) MT-32 sound module emulator\n"
		"\n"
		"Munt mt32emu_qt GUI Application Version " MT32EMU_QT_VERSION "\n"
		"Munt Library Version " + mt32emuVersion + "\n"
		"Qt Library Version " + qVersion() + "\n"
		"\n"
		"Build Arch: " BUILD_SYSTEM " " + QString::number(QSysInfo::WordSize) + "-bit\n"
		"Build Date: " BUILD_DATE "\n"
		"\n"
		"Copyright (C) 2011-2022 Jerome Fisher, Sergey V. Mikayev\n"
		"\n"
		"Licensed under GPL v3 or any later version."
	);
}